

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathVec.h
# Opt level: O1

float __thiscall Imath_2_5::Vec3<float>::lengthTiny(Vec3<float> *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  uint uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  
  uVar1 = this->x;
  uVar2 = this->y;
  uVar3 = -(uint)((float)uVar1 < -(float)uVar1);
  uVar4 = -(uint)((float)uVar2 < -(float)uVar2);
  fVar7 = (float)(~uVar3 & uVar1 | (uint)-(float)uVar1 & uVar3);
  fVar8 = (float)(~uVar4 & uVar2 | (uint)-(float)uVar2 & uVar4);
  fVar6 = this->z;
  uVar3 = -(uint)(fVar6 < -fVar6);
  fVar5 = (float)(~uVar3 & (uint)fVar6 | (uint)-fVar6 & uVar3);
  fVar6 = fVar8;
  if (fVar8 <= fVar7) {
    fVar6 = fVar7;
  }
  fVar9 = fVar5;
  if (fVar5 <= fVar6) {
    fVar9 = fVar6;
  }
  fVar6 = 0.0;
  if ((fVar9 != 0.0) || (NAN(fVar9))) {
    fVar6 = (fVar5 / fVar9) * (fVar5 / fVar9) +
            (fVar7 / fVar9) * (fVar7 / fVar9) + (fVar8 / fVar9) * (fVar8 / fVar9);
    if (fVar6 < 0.0) {
      fVar6 = sqrtf(fVar6);
    }
    else {
      fVar6 = SQRT(fVar6);
    }
    fVar6 = fVar9 * fVar6;
  }
  return fVar6;
}

Assistant:

T
Vec3<T>::lengthTiny () const
{
    T absX = (x >= T (0))? x: -x;
    T absY = (y >= T (0))? y: -y;
    T absZ = (z >= T (0))? z: -z;
    
    T max = absX;

    if (max < absY)
	max = absY;

    if (max < absZ)
	max = absZ;

    if (max == T (0))
	return T (0);

    //
    // Do not replace the divisions by max with multiplications by 1/max.
    // Computing 1/max can overflow but the divisions below will always
    // produce results less than or equal to 1.
    //

    absX /= max;
    absY /= max;
    absZ /= max;

    return max * Math<T>::sqrt (absX * absX + absY * absY + absZ * absZ);
}